

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O1

void __thiscall ON_FunctionList::~ON_FunctionList(ON_FunctionList *this)

{
  ON_Lock *this_00;
  bool bVar1;
  bool bVar2;
  
  this_00 = &this->m_lock;
  bVar1 = ON_Lock::GetLock(this_00,0x56);
  this->m_head = (void *)0x0;
  this->m_tail = (void *)0x0;
  ON_FixedSizePool::Destroy(&this->m_fsp);
  bVar2 = ON_Lock::ReturnLock(this_00,0x56);
  if (bVar2) {
    if (bVar1) goto LAB_00491f6a;
  }
  else {
    ON_Lock::BreakLock(this_00);
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_function_list.cpp"
             ,0x39,"",
             "Destroying a locked list - multiple delete or multiple delete or multiple exists.");
LAB_00491f6a:
  ON_FixedSizePool::~ON_FixedSizePool(&this->m_fsp);
  return;
}

Assistant:

ON_FunctionList::~ON_FunctionList()
{
  // The return value of m_lock.GetDefaultLock() is intentionally ignored
  // because this is a destructor.
  const int dtor_lock_value = 86;
  int dtor_error = 0;
  if (false == m_lock.GetLock(dtor_lock_value))
    dtor_error = 1;
  m_head=nullptr;
  m_tail=nullptr;
  m_fsp.Destroy();
  if (false == m_lock.ReturnLock(dtor_lock_value))
  {
    dtor_error += 2;
    m_lock.BreakLock();
  }
  if (dtor_error > 0 )
  {
    ON_ERROR("Destroying a locked list - multiple delete or multiple delete or multiple exists.");
  }
}